

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
CreateResponse::ToString(CreateResponse *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  BlockInfo *in_stack_ffffffffffffffe8;
  
  __lhs = in_RDI;
  FileInfo::ToString((FileInfo *)in_stack_ffffffffffffffe8);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  FileInfo::ToString((FileInfo *)in_stack_ffffffffffffffe8);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x163b05);
  BlockInfo::ToString(in_stack_ffffffffffffffe8);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x163b56);
  BlockInfo::ToString(in_stack_ffffffffffffffe8);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::string::~string(&stack0xffffffffffffff90);
  std::string::~string(&stack0xffffffffffffffe8);
  std::string::~string(local_20);
  std::string::~string(&stack0xffffffffffffff98);
  std::string::~string(local_28);
  std::string::~string(local_30);
  std::string::~string(local_60);
  std::string::~string(local_38);
  std::string::~string(local_40);
  std::string::~string(local_48);
  return __lhs;
}

Assistant:

virtual string ToString() const {
    return "CreateResponse:: " + file_info_.ToString() + ", " +
           parent_info_.ToString() + ", " + file_block_->ToString() + ", " +
           parent_block_->ToString();
  }